

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

int VP8InitFrame(VP8Decoder *dec,VP8Io *io)

{
  VP8FInfo *pVVar1;
  size_t __n;
  byte bVar2;
  int iVar3;
  int iVar4;
  WebPWorkerInterface *pWVar5;
  void *pvVar6;
  VP8TopSamples *pVVar7;
  uint8_t *puVar8;
  VP8MBData *pVVar9;
  int16_t *piVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  VP8FInfo *pVVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong nmemb;
  bool bVar20;
  
  dec->cache_id_ = 0;
  if (dec->mt_method_ < 1) {
    dec->num_caches_ = 1;
LAB_0012ef81:
    iVar4 = 1;
  }
  else {
    pWVar5 = WebPGetWorkerInterface();
    iVar4 = (*pWVar5->Reset)(&dec->worker_);
    if (iVar4 != 0) {
      (dec->worker_).data1 = dec;
      (dec->worker_).data2 = &(dec->thread_ctx_).io_;
      (dec->worker_).hook = FinishRow;
      dec->num_caches_ = 0 < dec->filter_type_ | 2;
      goto LAB_0012ef81;
    }
    iVar4 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"thread initialization failed.");
  }
  if (iVar4 == 0) {
    return 0;
  }
  iVar4 = dec->num_caches_;
  iVar14 = dec->mb_w_;
  lVar12 = (long)iVar14;
  if ((long)dec->filter_type_ < 1) {
    lVar19 = 0;
  }
  else {
    lVar19 = (long)(iVar14 << (0 < dec->mt_method_)) << 2;
  }
  __n = lVar12 * 2 + 2;
  bVar20 = dec->mt_method_ == 2;
  lVar11 = (long)(iVar14 << bVar20);
  iVar13 = iVar4 * 0x10;
  lVar18 = (long)((int)(((uint)""[dec->filter_type_] + iVar13) * 3) / 2) * lVar12 * 0x20;
  if (dec->alpha_data_ == (uint8_t *)0x0) {
    uVar15 = (ulong)(uint)(0 << bVar20);
  }
  else {
    uVar15 = (ulong)(dec->pic_hdr_).height_ * (ulong)(dec->pic_hdr_).width_;
  }
  nmemb = uVar15 + __n + lVar19 + lVar12 * 0x24 + lVar11 * 800 + lVar18 + 0x35f;
  if (dec->mem_size_ < nmemb) {
    WebPSafeFree(dec->mem_);
    dec->mem_size_ = 0;
    pvVar6 = WebPSafeMalloc(nmemb,1);
    dec->mem_ = pvVar6;
    if (pvVar6 == (void *)0x0) {
      iVar4 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"no memory during frame initialization.");
      if (iVar4 == 0) {
        return 0;
      }
      goto LAB_0012f237;
    }
    dec->mem_size_ = nmemb;
  }
  dec->intra_t_ = (uint8_t *)dec->mem_;
  pVVar7 = (VP8TopSamples *)((long)dec->mem_ + lVar12 * 4);
  dec->yuv_t_ = pVVar7;
  dec->mb_info_ = (VP8MB *)(pVVar7[lVar12].y + 2);
  pVVar1 = (VP8FInfo *)(pVVar7[lVar12].y + __n);
  pVVar16 = pVVar1;
  if (lVar19 == 0) {
    pVVar16 = (VP8FInfo *)0x0;
  }
  dec->f_info_ = pVVar16;
  (dec->thread_ctx_).id_ = 0;
  (dec->thread_ctx_).f_info_ = pVVar16;
  iVar3 = dec->filter_type_;
  if ((0 < (long)iVar3) && (0 < dec->mt_method_)) {
    (dec->thread_ctx_).f_info_ = pVVar16 + lVar12;
  }
  puVar8 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh_ + lVar19) & 0xffffffffffffffe0);
  dec->yuv_b_ = puVar8;
  pVVar9 = (VP8MBData *)(puVar8 + 0x340);
  dec->mb_data_ = pVVar9;
  (dec->thread_ctx_).mb_data_ = pVVar9;
  if (dec->mt_method_ == 2) {
    (dec->thread_ctx_).mb_data_ = pVVar9 + lVar12;
  }
  iVar17 = (int)(lVar12 * 0x10);
  dec->cache_y_stride_ = iVar17;
  iVar14 = iVar14 * 8;
  dec->cache_uv_stride_ = iVar14;
  bVar2 = ""[iVar3];
  piVar10 = (int16_t *)((long)pVVar9[lVar11].coeffs_ + (ulong)bVar2 * lVar12 * 0x10);
  dec->cache_y_ = (uint8_t *)piVar10;
  lVar19 = (long)(int)((uint)(bVar2 >> 1) * iVar14);
  puVar8 = (uint8_t *)((long)piVar10 + iVar13 * iVar17 + lVar19);
  dec->cache_u_ = puVar8;
  dec->cache_v_ = puVar8 + iVar4 * iVar14 * 8 + lVar19;
  dec->cache_id_ = 0;
  piVar10 = (int16_t *)((long)pVVar9[lVar11].coeffs_ + lVar18);
  if (uVar15 == 0) {
    piVar10 = (int16_t *)0x0;
  }
  dec->alpha_plane_ = (uint8_t *)piVar10;
  memset(pVVar7 + lVar12,0,__n);
  VP8InitScanline(dec);
  memset(dec->intra_t_,0,lVar12 * 4);
LAB_0012f237:
  io->mb_y = 0;
  puVar8 = dec->cache_u_;
  io->y = dec->cache_y_;
  io->u = puVar8;
  io->v = dec->cache_v_;
  iVar4 = dec->cache_uv_stride_;
  io->y_stride = dec->cache_y_stride_;
  io->uv_stride = iVar4;
  io->a = (uint8_t *)0x0;
  VP8DspInit();
  return 1;
}

Assistant:

int VP8InitFrame(VP8Decoder* const dec, VP8Io* const io) {
  if (!InitThreadContext(dec)) return 0;  // call first. Sets dec->num_caches_.
  if (!AllocateMemory(dec)) return 0;
  InitIo(dec, io);
  VP8DspInit();  // Init critical function pointers and look-up tables.
  return 1;
}